

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_ess_describe_scaling_rules.cc
# Opt level: O3

int __thiscall
aliyun::Ess::DescribeScalingRules
          (Ess *this,EssDescribeScalingRulesRequestType *req,
          EssDescribeScalingRulesResponseType *response,EssErrorInfo *error_info)

{
  iterator *piVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  Int IVar5;
  ArrayIndex AVar6;
  char *pcVar7;
  AliRpcRequest *this_00;
  long *plVar8;
  size_t sVar9;
  Value *pVVar10;
  Value *pVVar11;
  Value *pVVar12;
  size_type *psVar13;
  uint index;
  Value val;
  string secheme;
  string str_response;
  Reader reader;
  Value VStack_cd8;
  string local_cc0;
  EssDescribeScalingRulesResponseType *local_ca0;
  undefined1 local_c98 [32];
  _Alloc_hider local_c78;
  size_type local_c70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c68;
  _Alloc_hider local_c58;
  size_type local_c50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c48;
  Int local_c38;
  _Alloc_hider local_c30;
  size_type local_c28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c20;
  Int local_c10;
  Int local_c0c;
  Int local_c08;
  _Alloc_hider local_c00;
  size_type local_bf8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_bf0;
  long *local_be0;
  long local_bd8;
  long local_bd0 [2];
  string local_bc0;
  string local_ba0;
  string local_b80;
  string local_b60;
  string local_b40;
  string local_b20;
  string local_b00;
  string local_ae0;
  string local_ac0;
  string local_aa0;
  string local_a80;
  string local_a60;
  string local_a40;
  string local_a20;
  string local_a00;
  string local_9e0;
  string local_9c0;
  string local_9a0;
  string local_980;
  string local_960;
  string local_940;
  string local_920;
  string local_900;
  string local_8e0;
  string local_8c0;
  string local_8a0;
  string local_880;
  string local_860;
  string local_840;
  string local_820;
  string local_800;
  string local_7e0;
  string local_7c0;
  string local_7a0;
  string local_780;
  string local_760;
  string local_740;
  string local_720;
  string local_700;
  string local_6e0;
  string local_6c0;
  string local_6a0;
  string local_680;
  string local_660;
  string local_640;
  string local_620;
  string local_600;
  string local_5e0;
  string local_5c0;
  string local_5a0;
  string local_580;
  string local_560;
  string local_540;
  string local_520;
  string local_500;
  string local_4e0;
  string local_4c0;
  string local_4a0;
  string local_480;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  Reader local_140;
  
  local_bc0._M_dataplus._M_p = (pointer)&local_bc0.field_2;
  local_bc0._M_string_length = 0;
  local_bc0.field_2._M_local_buf[0] = '\0';
  pcVar7 = "http";
  if ((ulong)this->use_tls_ != 0) {
    pcVar7 = "https";
  }
  local_be0 = local_bd0;
  local_ca0 = response;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_be0,pcVar7,pcVar7 + (ulong)this->use_tls_ + 4);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,this->version_,(allocator<char> *)local_c98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->appid_,(allocator<char> *)&local_cc0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->secret_,(allocator<char> *)&VStack_cd8);
  piVar1 = &local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_start;
  local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
  super__Deque_impl_data._M_map = &piVar1->_M_cur;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_140,local_be0,local_bd8 + (long)local_be0);
  std::__cxx11::string::append((char *)&local_140);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_140);
  psVar13 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_ba0.field_2._M_allocated_capacity = *psVar13;
    local_ba0.field_2._8_8_ = plVar8[3];
    local_ba0._M_dataplus._M_p = (pointer)&local_ba0.field_2;
  }
  else {
    local_ba0.field_2._M_allocated_capacity = *psVar13;
    local_ba0._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_ba0._M_string_length = plVar8[1];
  *plVar8 = (long)psVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  AliRpcRequest::AliRpcRequest(this_00,&local_160,&local_180,&local_1a0,&local_ba0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ba0._M_dataplus._M_p != &local_ba0.field_2) {
    operator_delete(local_ba0._M_dataplus._M_p,local_ba0.field_2._M_allocated_capacity + 1);
  }
  if ((iterator *)
      local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_map != piVar1) {
    operator_delete(local_140.nodes_.c.
                    super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                    super__Deque_impl_data._M_map,
                    (long)local_140.nodes_.c.
                          super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (((this->use_tls_ == false) && (pcVar7 = this->proxy_host_, pcVar7 != (char *)0x0)) &&
     (*pcVar7 != '\0')) {
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    sVar9 = strlen(pcVar7);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,pcVar7,pcVar7 + sVar9);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
  }
  Json::Value::Value(&VStack_cd8,nullValue);
  Json::Reader::Reader(&local_140);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"Action","");
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"DescribeScalingRules","");
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_200,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((req->owner_id)._M_string_length != 0) {
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"OwnerId","");
    pcVar2 = (req->owner_id)._M_dataplus._M_p;
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_260,pcVar2,pcVar2 + (req->owner_id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_240,&local_260);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->resource_owner_account)._M_string_length != 0) {
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"ResourceOwnerAccount","");
    pcVar2 = (req->resource_owner_account)._M_dataplus._M_p;
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a0,pcVar2,pcVar2 + (req->resource_owner_account)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_280,&local_2a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->resource_owner_id)._M_string_length != 0) {
    local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"ResourceOwnerId","");
    pcVar2 = (req->resource_owner_id)._M_dataplus._M_p;
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2e0,pcVar2,pcVar2 + (req->resource_owner_id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2c0,&local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->page_number)._M_string_length != 0) {
    local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"PageNumber","");
    pcVar2 = (req->page_number)._M_dataplus._M_p;
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_320,pcVar2,pcVar2 + (req->page_number)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_300,&local_320);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->page_size)._M_string_length != 0) {
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"PageSize","");
    pcVar2 = (req->page_size)._M_dataplus._M_p;
    local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_360,pcVar2,pcVar2 + (req->page_size)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_340,&local_360);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scaling_group_id)._M_string_length != 0) {
    local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"ScalingGroupId","");
    pcVar2 = (req->scaling_group_id)._M_dataplus._M_p;
    local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3a0,pcVar2,pcVar2 + (req->scaling_group_id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_380,&local_3a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scaling_rule_id1)._M_string_length != 0) {
    local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"ScalingRuleId.1","");
    pcVar2 = (req->scaling_rule_id1)._M_dataplus._M_p;
    local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3e0,pcVar2,pcVar2 + (req->scaling_rule_id1)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_3c0,&local_3e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
      operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scaling_rule_id2)._M_string_length != 0) {
    local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"ScalingRuleId.2","");
    pcVar2 = (req->scaling_rule_id2)._M_dataplus._M_p;
    local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_420,pcVar2,pcVar2 + (req->scaling_rule_id2)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_400,&local_420);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._M_dataplus._M_p != &local_420.field_2) {
      operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_400._M_dataplus._M_p != &local_400.field_2) {
      operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scaling_rule_id3)._M_string_length != 0) {
    local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"ScalingRuleId.3","");
    pcVar2 = (req->scaling_rule_id3)._M_dataplus._M_p;
    local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_460,pcVar2,pcVar2 + (req->scaling_rule_id3)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_440,&local_460);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_dataplus._M_p != &local_460.field_2) {
      operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_440._M_dataplus._M_p != &local_440.field_2) {
      operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scaling_rule_id4)._M_string_length != 0) {
    local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"ScalingRuleId.4","");
    pcVar2 = (req->scaling_rule_id4)._M_dataplus._M_p;
    local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4a0,pcVar2,pcVar2 + (req->scaling_rule_id4)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_480,&local_4a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
      operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_480._M_dataplus._M_p != &local_480.field_2) {
      operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scaling_rule_id5)._M_string_length != 0) {
    local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c0,"ScalingRuleId.5","");
    pcVar2 = (req->scaling_rule_id5)._M_dataplus._M_p;
    local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4e0,pcVar2,pcVar2 + (req->scaling_rule_id5)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_4c0,&local_4e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
      operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
      operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scaling_rule_id6)._M_string_length != 0) {
    local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"ScalingRuleId.6","");
    pcVar2 = (req->scaling_rule_id6)._M_dataplus._M_p;
    local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_520,pcVar2,pcVar2 + (req->scaling_rule_id6)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_500,&local_520);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_520._M_dataplus._M_p != &local_520.field_2) {
      operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_500._M_dataplus._M_p != &local_500.field_2) {
      operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scaling_rule_id7)._M_string_length != 0) {
    local_540._M_dataplus._M_p = (pointer)&local_540.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_540,"ScalingRuleId.7","");
    pcVar2 = (req->scaling_rule_id7)._M_dataplus._M_p;
    local_560._M_dataplus._M_p = (pointer)&local_560.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_560,pcVar2,pcVar2 + (req->scaling_rule_id7)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_540,&local_560);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_560._M_dataplus._M_p != &local_560.field_2) {
      operator_delete(local_560._M_dataplus._M_p,local_560.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_540._M_dataplus._M_p != &local_540.field_2) {
      operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scaling_rule_id8)._M_string_length != 0) {
    local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_580,"ScalingRuleId.8","");
    pcVar2 = (req->scaling_rule_id8)._M_dataplus._M_p;
    local_5a0._M_dataplus._M_p = (pointer)&local_5a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_5a0,pcVar2,pcVar2 + (req->scaling_rule_id8)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_580,&local_5a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
      operator_delete(local_5a0._M_dataplus._M_p,local_5a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_580._M_dataplus._M_p != &local_580.field_2) {
      operator_delete(local_580._M_dataplus._M_p,local_580.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scaling_rule_id9)._M_string_length != 0) {
    local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c0,"ScalingRuleId.9","");
    pcVar2 = (req->scaling_rule_id9)._M_dataplus._M_p;
    local_5e0._M_dataplus._M_p = (pointer)&local_5e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_5e0,pcVar2,pcVar2 + (req->scaling_rule_id9)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_5c0,&local_5e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
      operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
      operator_delete(local_5c0._M_dataplus._M_p,local_5c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scaling_rule_id10)._M_string_length != 0) {
    local_600._M_dataplus._M_p = (pointer)&local_600.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_600,"ScalingRuleId.10","");
    pcVar2 = (req->scaling_rule_id10)._M_dataplus._M_p;
    local_620._M_dataplus._M_p = (pointer)&local_620.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_620,pcVar2,pcVar2 + (req->scaling_rule_id10)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_600,&local_620);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_620._M_dataplus._M_p != &local_620.field_2) {
      operator_delete(local_620._M_dataplus._M_p,local_620.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_600._M_dataplus._M_p != &local_600.field_2) {
      operator_delete(local_600._M_dataplus._M_p,local_600.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scaling_rule_name1)._M_string_length != 0) {
    local_640._M_dataplus._M_p = (pointer)&local_640.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_640,"ScalingRuleName.1","");
    pcVar2 = (req->scaling_rule_name1)._M_dataplus._M_p;
    local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_660,pcVar2,pcVar2 + (req->scaling_rule_name1)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_640,&local_660);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_660._M_dataplus._M_p != &local_660.field_2) {
      operator_delete(local_660._M_dataplus._M_p,local_660.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_640._M_dataplus._M_p != &local_640.field_2) {
      operator_delete(local_640._M_dataplus._M_p,local_640.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scaling_rule_name2)._M_string_length != 0) {
    local_680._M_dataplus._M_p = (pointer)&local_680.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_680,"ScalingRuleName.2","");
    pcVar2 = (req->scaling_rule_name2)._M_dataplus._M_p;
    local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_6a0,pcVar2,pcVar2 + (req->scaling_rule_name2)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_680,&local_6a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
      operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_680._M_dataplus._M_p != &local_680.field_2) {
      operator_delete(local_680._M_dataplus._M_p,local_680.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scaling_rule_name3)._M_string_length != 0) {
    local_6c0._M_dataplus._M_p = (pointer)&local_6c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c0,"ScalingRuleName.3","");
    pcVar2 = (req->scaling_rule_name3)._M_dataplus._M_p;
    local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_6e0,pcVar2,pcVar2 + (req->scaling_rule_name3)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_6c0,&local_6e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
      operator_delete(local_6e0._M_dataplus._M_p,local_6e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
      operator_delete(local_6c0._M_dataplus._M_p,local_6c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scaling_rule_name4)._M_string_length != 0) {
    local_700._M_dataplus._M_p = (pointer)&local_700.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_700,"ScalingRuleName.4","");
    pcVar2 = (req->scaling_rule_name4)._M_dataplus._M_p;
    local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_720,pcVar2,pcVar2 + (req->scaling_rule_name4)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_700,&local_720);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_720._M_dataplus._M_p != &local_720.field_2) {
      operator_delete(local_720._M_dataplus._M_p,local_720.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_700._M_dataplus._M_p != &local_700.field_2) {
      operator_delete(local_700._M_dataplus._M_p,local_700.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scaling_rule_name5)._M_string_length != 0) {
    local_740._M_dataplus._M_p = (pointer)&local_740.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_740,"ScalingRuleName.5","");
    pcVar2 = (req->scaling_rule_name5)._M_dataplus._M_p;
    local_760._M_dataplus._M_p = (pointer)&local_760.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_760,pcVar2,pcVar2 + (req->scaling_rule_name5)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_740,&local_760);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_760._M_dataplus._M_p != &local_760.field_2) {
      operator_delete(local_760._M_dataplus._M_p,local_760.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_740._M_dataplus._M_p != &local_740.field_2) {
      operator_delete(local_740._M_dataplus._M_p,local_740.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scaling_rule_name6)._M_string_length != 0) {
    local_780._M_dataplus._M_p = (pointer)&local_780.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_780,"ScalingRuleName.6","");
    pcVar2 = (req->scaling_rule_name6)._M_dataplus._M_p;
    local_7a0._M_dataplus._M_p = (pointer)&local_7a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_7a0,pcVar2,pcVar2 + (req->scaling_rule_name6)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_780,&local_7a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7a0._M_dataplus._M_p != &local_7a0.field_2) {
      operator_delete(local_7a0._M_dataplus._M_p,local_7a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_780._M_dataplus._M_p != &local_780.field_2) {
      operator_delete(local_780._M_dataplus._M_p,local_780.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scaling_rule_name7)._M_string_length != 0) {
    local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c0,"ScalingRuleName.7","");
    pcVar2 = (req->scaling_rule_name7)._M_dataplus._M_p;
    local_7e0._M_dataplus._M_p = (pointer)&local_7e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_7e0,pcVar2,pcVar2 + (req->scaling_rule_name7)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_7c0,&local_7e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7e0._M_dataplus._M_p != &local_7e0.field_2) {
      operator_delete(local_7e0._M_dataplus._M_p,local_7e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
      operator_delete(local_7c0._M_dataplus._M_p,local_7c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scaling_rule_name8)._M_string_length != 0) {
    local_800._M_dataplus._M_p = (pointer)&local_800.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_800,"ScalingRuleName.8","");
    pcVar2 = (req->scaling_rule_name8)._M_dataplus._M_p;
    local_820._M_dataplus._M_p = (pointer)&local_820.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_820,pcVar2,pcVar2 + (req->scaling_rule_name8)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_800,&local_820);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_820._M_dataplus._M_p != &local_820.field_2) {
      operator_delete(local_820._M_dataplus._M_p,local_820.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_800._M_dataplus._M_p != &local_800.field_2) {
      operator_delete(local_800._M_dataplus._M_p,local_800.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scaling_rule_name9)._M_string_length != 0) {
    local_840._M_dataplus._M_p = (pointer)&local_840.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_840,"ScalingRuleName.9","");
    pcVar2 = (req->scaling_rule_name9)._M_dataplus._M_p;
    local_860._M_dataplus._M_p = (pointer)&local_860.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_860,pcVar2,pcVar2 + (req->scaling_rule_name9)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_840,&local_860);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_860._M_dataplus._M_p != &local_860.field_2) {
      operator_delete(local_860._M_dataplus._M_p,local_860.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_840._M_dataplus._M_p != &local_840.field_2) {
      operator_delete(local_840._M_dataplus._M_p,local_840.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scaling_rule_name10)._M_string_length != 0) {
    local_880._M_dataplus._M_p = (pointer)&local_880.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_880,"ScalingRuleName.10","");
    pcVar2 = (req->scaling_rule_name10)._M_dataplus._M_p;
    local_8a0._M_dataplus._M_p = (pointer)&local_8a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_8a0,pcVar2,pcVar2 + (req->scaling_rule_name10)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_880,&local_8a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8a0._M_dataplus._M_p != &local_8a0.field_2) {
      operator_delete(local_8a0._M_dataplus._M_p,local_8a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_880._M_dataplus._M_p != &local_880.field_2) {
      operator_delete(local_880._M_dataplus._M_p,local_880.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scaling_rule_ari1)._M_string_length != 0) {
    local_8c0._M_dataplus._M_p = (pointer)&local_8c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_8c0,"ScalingRuleAri.1","");
    pcVar2 = (req->scaling_rule_ari1)._M_dataplus._M_p;
    local_8e0._M_dataplus._M_p = (pointer)&local_8e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_8e0,pcVar2,pcVar2 + (req->scaling_rule_ari1)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_8c0,&local_8e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8e0._M_dataplus._M_p != &local_8e0.field_2) {
      operator_delete(local_8e0._M_dataplus._M_p,local_8e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8c0._M_dataplus._M_p != &local_8c0.field_2) {
      operator_delete(local_8c0._M_dataplus._M_p,local_8c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scaling_rule_ari2)._M_string_length != 0) {
    local_900._M_dataplus._M_p = (pointer)&local_900.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_900,"ScalingRuleAri.2","");
    pcVar2 = (req->scaling_rule_ari2)._M_dataplus._M_p;
    local_920._M_dataplus._M_p = (pointer)&local_920.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_920,pcVar2,pcVar2 + (req->scaling_rule_ari2)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_900,&local_920);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_920._M_dataplus._M_p != &local_920.field_2) {
      operator_delete(local_920._M_dataplus._M_p,local_920.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_900._M_dataplus._M_p != &local_900.field_2) {
      operator_delete(local_900._M_dataplus._M_p,local_900.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scaling_rule_ari3)._M_string_length != 0) {
    local_940._M_dataplus._M_p = (pointer)&local_940.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_940,"ScalingRuleAri.3","");
    pcVar2 = (req->scaling_rule_ari3)._M_dataplus._M_p;
    local_960._M_dataplus._M_p = (pointer)&local_960.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_960,pcVar2,pcVar2 + (req->scaling_rule_ari3)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_940,&local_960);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_960._M_dataplus._M_p != &local_960.field_2) {
      operator_delete(local_960._M_dataplus._M_p,local_960.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_940._M_dataplus._M_p != &local_940.field_2) {
      operator_delete(local_940._M_dataplus._M_p,local_940.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scaling_rule_ari4)._M_string_length != 0) {
    local_980._M_dataplus._M_p = (pointer)&local_980.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_980,"ScalingRuleAri.4","");
    pcVar2 = (req->scaling_rule_ari4)._M_dataplus._M_p;
    local_9a0._M_dataplus._M_p = (pointer)&local_9a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_9a0,pcVar2,pcVar2 + (req->scaling_rule_ari4)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_980,&local_9a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9a0._M_dataplus._M_p != &local_9a0.field_2) {
      operator_delete(local_9a0._M_dataplus._M_p,local_9a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_980._M_dataplus._M_p != &local_980.field_2) {
      operator_delete(local_980._M_dataplus._M_p,local_980.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scaling_rule_ari5)._M_string_length != 0) {
    local_9c0._M_dataplus._M_p = (pointer)&local_9c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_9c0,"ScalingRuleAri.5","");
    pcVar2 = (req->scaling_rule_ari5)._M_dataplus._M_p;
    local_9e0._M_dataplus._M_p = (pointer)&local_9e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_9e0,pcVar2,pcVar2 + (req->scaling_rule_ari5)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_9c0,&local_9e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9e0._M_dataplus._M_p != &local_9e0.field_2) {
      operator_delete(local_9e0._M_dataplus._M_p,local_9e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9c0._M_dataplus._M_p != &local_9c0.field_2) {
      operator_delete(local_9c0._M_dataplus._M_p,local_9c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scaling_rule_ari6)._M_string_length != 0) {
    local_a00._M_dataplus._M_p = (pointer)&local_a00.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a00,"ScalingRuleAri.6","");
    pcVar2 = (req->scaling_rule_ari6)._M_dataplus._M_p;
    local_a20._M_dataplus._M_p = (pointer)&local_a20.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a20,pcVar2,pcVar2 + (req->scaling_rule_ari6)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_a00,&local_a20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a20._M_dataplus._M_p != &local_a20.field_2) {
      operator_delete(local_a20._M_dataplus._M_p,local_a20.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a00._M_dataplus._M_p != &local_a00.field_2) {
      operator_delete(local_a00._M_dataplus._M_p,local_a00.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scaling_rule_ari7)._M_string_length != 0) {
    local_a40._M_dataplus._M_p = (pointer)&local_a40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a40,"ScalingRuleAri.7","");
    pcVar2 = (req->scaling_rule_ari7)._M_dataplus._M_p;
    local_a60._M_dataplus._M_p = (pointer)&local_a60.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a60,pcVar2,pcVar2 + (req->scaling_rule_ari7)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_a40,&local_a60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a60._M_dataplus._M_p != &local_a60.field_2) {
      operator_delete(local_a60._M_dataplus._M_p,local_a60.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a40._M_dataplus._M_p != &local_a40.field_2) {
      operator_delete(local_a40._M_dataplus._M_p,local_a40.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scaling_rule_ari8)._M_string_length != 0) {
    local_a80._M_dataplus._M_p = (pointer)&local_a80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a80,"ScalingRuleAri.8","");
    pcVar2 = (req->scaling_rule_ari8)._M_dataplus._M_p;
    local_aa0._M_dataplus._M_p = (pointer)&local_aa0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_aa0,pcVar2,pcVar2 + (req->scaling_rule_ari8)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_a80,&local_aa0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_aa0._M_dataplus._M_p != &local_aa0.field_2) {
      operator_delete(local_aa0._M_dataplus._M_p,local_aa0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a80._M_dataplus._M_p != &local_a80.field_2) {
      operator_delete(local_a80._M_dataplus._M_p,local_a80.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scaling_rule_ari9)._M_string_length != 0) {
    local_ac0._M_dataplus._M_p = (pointer)&local_ac0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_ac0,"ScalingRuleAri.9","");
    pcVar2 = (req->scaling_rule_ari9)._M_dataplus._M_p;
    local_ae0._M_dataplus._M_p = (pointer)&local_ae0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_ae0,pcVar2,pcVar2 + (req->scaling_rule_ari9)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_ac0,&local_ae0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ae0._M_dataplus._M_p != &local_ae0.field_2) {
      operator_delete(local_ae0._M_dataplus._M_p,local_ae0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ac0._M_dataplus._M_p != &local_ac0.field_2) {
      operator_delete(local_ac0._M_dataplus._M_p,local_ac0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scaling_rule_ari10)._M_string_length != 0) {
    local_b00._M_dataplus._M_p = (pointer)&local_b00.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b00,"ScalingRuleAri.10","");
    pcVar2 = (req->scaling_rule_ari10)._M_dataplus._M_p;
    local_b20._M_dataplus._M_p = (pointer)&local_b20.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b20,pcVar2,pcVar2 + (req->scaling_rule_ari10)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_b00,&local_b20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b20._M_dataplus._M_p != &local_b20.field_2) {
      operator_delete(local_b20._M_dataplus._M_p,local_b20.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b00._M_dataplus._M_p != &local_b00.field_2) {
      operator_delete(local_b00._M_dataplus._M_p,local_b00.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->owner_account)._M_string_length != 0) {
    local_b40._M_dataplus._M_p = (pointer)&local_b40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b40,"OwnerAccount","");
    pcVar2 = (req->owner_account)._M_dataplus._M_p;
    local_b60._M_dataplus._M_p = (pointer)&local_b60.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b60,pcVar2,pcVar2 + (req->owner_account)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_b40,&local_b60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b60._M_dataplus._M_p != &local_b60.field_2) {
      operator_delete(local_b60._M_dataplus._M_p,local_b60.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b40._M_dataplus._M_p != &local_b40.field_2) {
      operator_delete(local_b40._M_dataplus._M_p,local_b40.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    local_b80._M_dataplus._M_p = (pointer)&local_b80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b80,"RegionId","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,this->region_id_,(allocator<char> *)local_c98);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_b80,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b80._M_dataplus._M_p != &local_b80.field_2) {
      operator_delete(local_b80._M_dataplus._M_p,local_b80.field_2._M_allocated_capacity + 1);
    }
  }
  iVar4 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar4 == 0) {
    iVar4 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&local_bc0);
    if (((0 < iVar4) && (local_bc0._M_string_length != 0)) &&
       (bVar3 = Json::Reader::parse(&local_140,&local_bc0,&VStack_cd8,true), bVar3)) {
      if (error_info != (EssErrorInfo *)0x0 && iVar4 != 200) {
        bVar3 = Json::Value::isMember(&VStack_cd8,"RequestId");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&VStack_cd8,"RequestId");
          Json::Value::asString_abi_cxx11_((string *)local_c98,pVVar10);
        }
        else {
          local_c98._0_8_ = local_c98 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_c98,anon_var_dwarf_211f3a + 9);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)local_c98);
        pcVar2 = local_c98 + 0x10;
        if ((pointer)local_c98._0_8_ != pcVar2) {
          operator_delete((void *)local_c98._0_8_,CONCAT71(local_c98._17_7_,local_c98[0x10]) + 1);
        }
        bVar3 = Json::Value::isMember(&VStack_cd8,"Code");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&VStack_cd8,"Code");
          Json::Value::asString_abi_cxx11_((string *)local_c98,pVVar10);
        }
        else {
          local_c98._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_c98,anon_var_dwarf_211f3a + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)local_c98);
        if ((pointer)local_c98._0_8_ != pcVar2) {
          operator_delete((void *)local_c98._0_8_,CONCAT71(local_c98._17_7_,local_c98[0x10]) + 1);
        }
        bVar3 = Json::Value::isMember(&VStack_cd8,"HostId");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&VStack_cd8,"HostId");
          Json::Value::asString_abi_cxx11_((string *)local_c98,pVVar10);
        }
        else {
          local_c98._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_c98,anon_var_dwarf_211f3a + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)local_c98);
        if ((pointer)local_c98._0_8_ != pcVar2) {
          operator_delete((void *)local_c98._0_8_,CONCAT71(local_c98._17_7_,local_c98[0x10]) + 1);
        }
        bVar3 = Json::Value::isMember(&VStack_cd8,"Message");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&VStack_cd8,"Message");
          Json::Value::asString_abi_cxx11_((string *)local_c98,pVVar10);
        }
        else {
          local_c98._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_c98,anon_var_dwarf_211f3a + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)local_c98);
        if ((pointer)local_c98._0_8_ != pcVar2) {
          operator_delete((void *)local_c98._0_8_,CONCAT71(local_c98._17_7_,local_c98[0x10]) + 1);
        }
      }
      if (local_ca0 != (EssDescribeScalingRulesResponseType *)0x0 && iVar4 == 200) {
        bVar3 = Json::Value::isMember(&VStack_cd8,"TotalCount");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&VStack_cd8,"TotalCount");
          IVar5 = Json::Value::asInt(pVVar10);
          local_ca0->total_count = IVar5;
        }
        bVar3 = Json::Value::isMember(&VStack_cd8,"PageNumber");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&VStack_cd8,"PageNumber");
          IVar5 = Json::Value::asInt(pVVar10);
          local_ca0->page_number = IVar5;
        }
        bVar3 = Json::Value::isMember(&VStack_cd8,"PageSize");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&VStack_cd8,"PageSize");
          IVar5 = Json::Value::asInt(pVVar10);
          local_ca0->page_size = IVar5;
        }
        bVar3 = Json::Value::isMember(&VStack_cd8,"ScalingRules");
        iVar4 = 200;
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&VStack_cd8,"ScalingRules");
          bVar3 = Json::Value::isMember(pVVar10,"ScalingRule");
          if (bVar3) {
            pVVar10 = Json::Value::operator[](&VStack_cd8,"ScalingRules");
            pVVar10 = Json::Value::operator[](pVVar10,"ScalingRule");
            bVar3 = Json::Value::isArray(pVVar10);
            if ((bVar3) && (AVar6 = Json::Value::size(pVVar10), AVar6 != 0)) {
              index = 0;
              do {
                local_c98._0_8_ = local_c98 + 0x10;
                local_c98._8_8_ = 0;
                local_c98[0x10] = '\0';
                local_c78._M_p = (pointer)&local_c68;
                local_c70 = 0;
                local_c68._M_local_buf[0] = '\0';
                local_c58._M_p = (pointer)&local_c48;
                local_c50 = 0;
                local_c48._M_local_buf[0] = '\0';
                local_c30._M_p = (pointer)&local_c20;
                local_c28 = 0;
                local_c20._M_local_buf[0] = '\0';
                local_c00._M_p = (pointer)&local_bf0;
                local_bf8 = 0;
                local_bf0._M_local_buf[0] = '\0';
                pVVar11 = Json::Value::operator[](pVVar10,index);
                bVar3 = Json::Value::isMember(pVVar11,"ScalingRuleId");
                if (bVar3) {
                  pVVar12 = Json::Value::operator[](pVVar11,"ScalingRuleId");
                  Json::Value::asString_abi_cxx11_(&local_cc0,pVVar12);
                  std::__cxx11::string::operator=((string *)local_c98,(string *)&local_cc0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_cc0._M_dataplus._M_p != &local_cc0.field_2) {
                    operator_delete(local_cc0._M_dataplus._M_p,
                                    local_cc0.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar11,"ScalingGroupId");
                if (bVar3) {
                  pVVar12 = Json::Value::operator[](pVVar11,"ScalingGroupId");
                  Json::Value::asString_abi_cxx11_(&local_cc0,pVVar12);
                  std::__cxx11::string::operator=((string *)&local_c78,(string *)&local_cc0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_cc0._M_dataplus._M_p != &local_cc0.field_2) {
                    operator_delete(local_cc0._M_dataplus._M_p,
                                    local_cc0.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar11,"ScalingRuleName");
                if (bVar3) {
                  pVVar12 = Json::Value::operator[](pVVar11,"ScalingRuleName");
                  Json::Value::asString_abi_cxx11_(&local_cc0,pVVar12);
                  std::__cxx11::string::operator=((string *)&local_c58,(string *)&local_cc0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_cc0._M_dataplus._M_p != &local_cc0.field_2) {
                    operator_delete(local_cc0._M_dataplus._M_p,
                                    local_cc0.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar11,"Cooldown");
                if (bVar3) {
                  pVVar12 = Json::Value::operator[](pVVar11,"Cooldown");
                  local_c38 = Json::Value::asInt(pVVar12);
                }
                bVar3 = Json::Value::isMember(pVVar11,"AdjustmentType");
                if (bVar3) {
                  pVVar12 = Json::Value::operator[](pVVar11,"AdjustmentType");
                  Json::Value::asString_abi_cxx11_(&local_cc0,pVVar12);
                  std::__cxx11::string::operator=((string *)&local_c30,(string *)&local_cc0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_cc0._M_dataplus._M_p != &local_cc0.field_2) {
                    operator_delete(local_cc0._M_dataplus._M_p,
                                    local_cc0.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar11,"AdjustmentValue");
                if (bVar3) {
                  pVVar12 = Json::Value::operator[](pVVar11,"AdjustmentValue");
                  local_c10 = Json::Value::asInt(pVVar12);
                }
                bVar3 = Json::Value::isMember(pVVar11,"MinSize");
                if (bVar3) {
                  pVVar12 = Json::Value::operator[](pVVar11,"MinSize");
                  local_c0c = Json::Value::asInt(pVVar12);
                }
                bVar3 = Json::Value::isMember(pVVar11,"MaxSize");
                if (bVar3) {
                  pVVar12 = Json::Value::operator[](pVVar11,"MaxSize");
                  local_c08 = Json::Value::asInt(pVVar12);
                }
                bVar3 = Json::Value::isMember(pVVar11,"ScalingRuleAri");
                if (bVar3) {
                  pVVar11 = Json::Value::operator[](pVVar11,"ScalingRuleAri");
                  Json::Value::asString_abi_cxx11_(&local_cc0,pVVar11);
                  std::__cxx11::string::operator=((string *)&local_c00,(string *)&local_cc0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_cc0._M_dataplus._M_p != &local_cc0.field_2) {
                    operator_delete(local_cc0._M_dataplus._M_p,
                                    local_cc0.field_2._M_allocated_capacity + 1);
                  }
                }
                std::
                vector<aliyun::EssDescribeScalingRulesScalingRuleType,_std::allocator<aliyun::EssDescribeScalingRulesScalingRuleType>_>
                ::push_back(&local_ca0->scaling_rules,(value_type *)local_c98);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c00._M_p != &local_bf0) {
                  operator_delete(local_c00._M_p,
                                  CONCAT71(local_bf0._M_allocated_capacity._1_7_,
                                           local_bf0._M_local_buf[0]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c30._M_p != &local_c20) {
                  operator_delete(local_c30._M_p,
                                  CONCAT71(local_c20._M_allocated_capacity._1_7_,
                                           local_c20._M_local_buf[0]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c58._M_p != &local_c48) {
                  operator_delete(local_c58._M_p,
                                  CONCAT71(local_c48._M_allocated_capacity._1_7_,
                                           local_c48._M_local_buf[0]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c78._M_p != &local_c68) {
                  operator_delete(local_c78._M_p,
                                  CONCAT71(local_c68._M_allocated_capacity._1_7_,
                                           local_c68._M_local_buf[0]) + 1);
                }
                if ((undefined1 *)local_c98._0_8_ != local_c98 + 0x10) {
                  operator_delete((void *)local_c98._0_8_,
                                  CONCAT71(local_c98._17_7_,local_c98[0x10]) + 1);
                }
                AVar6 = Json::Value::size(pVVar10);
                index = index + 1;
              } while (index < AVar6);
            }
          }
        }
      }
      goto LAB_0014413f;
    }
    if (error_info == (EssErrorInfo *)0x0) goto LAB_0014413a;
    pcVar7 = "parse response failed";
  }
  else {
    if (error_info == (EssErrorInfo *)0x0) {
LAB_0014413a:
      iVar4 = -1;
      goto LAB_0014413f;
    }
    pcVar7 = "connect to host failed";
  }
  iVar4 = -1;
  std::__cxx11::string::_M_replace
            ((ulong)&error_info->code,0,(char *)(error_info->code)._M_string_length,(ulong)pcVar7);
LAB_0014413f:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.commentsBefore_._M_dataplus._M_p != &local_140.commentsBefore_.field_2) {
    operator_delete(local_140.commentsBefore_._M_dataplus._M_p,
                    local_140.commentsBefore_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.document_._M_dataplus._M_p != &local_140.document_.field_2) {
    operator_delete(local_140.document_._M_dataplus._M_p,
                    local_140.document_.field_2._M_allocated_capacity + 1);
  }
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
            (&local_140.errors_);
  std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
            ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&local_140);
  Json::Value::~Value(&VStack_cd8);
  if (local_be0 != local_bd0) {
    operator_delete(local_be0,local_bd0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bc0._M_dataplus._M_p != &local_bc0.field_2) {
    operator_delete(local_bc0._M_dataplus._M_p,
                    CONCAT71(local_bc0.field_2._M_allocated_capacity._1_7_,
                             local_bc0.field_2._M_local_buf[0]) + 1);
  }
  return iVar4;
}

Assistant:

int Ess::DescribeScalingRules(const EssDescribeScalingRulesRequestType& req,
                      EssDescribeScalingRulesResponseType* response,
                       EssErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","DescribeScalingRules");
  if(!req.owner_id.empty()) {
    req_rpc->AddRequestQuery("OwnerId", req.owner_id);
  }
  if(!req.resource_owner_account.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerAccount", req.resource_owner_account);
  }
  if(!req.resource_owner_id.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerId", req.resource_owner_id);
  }
  if(!req.page_number.empty()) {
    req_rpc->AddRequestQuery("PageNumber", req.page_number);
  }
  if(!req.page_size.empty()) {
    req_rpc->AddRequestQuery("PageSize", req.page_size);
  }
  if(!req.scaling_group_id.empty()) {
    req_rpc->AddRequestQuery("ScalingGroupId", req.scaling_group_id);
  }
  if(!req.scaling_rule_id1.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleId.1", req.scaling_rule_id1);
  }
  if(!req.scaling_rule_id2.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleId.2", req.scaling_rule_id2);
  }
  if(!req.scaling_rule_id3.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleId.3", req.scaling_rule_id3);
  }
  if(!req.scaling_rule_id4.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleId.4", req.scaling_rule_id4);
  }
  if(!req.scaling_rule_id5.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleId.5", req.scaling_rule_id5);
  }
  if(!req.scaling_rule_id6.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleId.6", req.scaling_rule_id6);
  }
  if(!req.scaling_rule_id7.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleId.7", req.scaling_rule_id7);
  }
  if(!req.scaling_rule_id8.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleId.8", req.scaling_rule_id8);
  }
  if(!req.scaling_rule_id9.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleId.9", req.scaling_rule_id9);
  }
  if(!req.scaling_rule_id10.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleId.10", req.scaling_rule_id10);
  }
  if(!req.scaling_rule_name1.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleName.1", req.scaling_rule_name1);
  }
  if(!req.scaling_rule_name2.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleName.2", req.scaling_rule_name2);
  }
  if(!req.scaling_rule_name3.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleName.3", req.scaling_rule_name3);
  }
  if(!req.scaling_rule_name4.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleName.4", req.scaling_rule_name4);
  }
  if(!req.scaling_rule_name5.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleName.5", req.scaling_rule_name5);
  }
  if(!req.scaling_rule_name6.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleName.6", req.scaling_rule_name6);
  }
  if(!req.scaling_rule_name7.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleName.7", req.scaling_rule_name7);
  }
  if(!req.scaling_rule_name8.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleName.8", req.scaling_rule_name8);
  }
  if(!req.scaling_rule_name9.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleName.9", req.scaling_rule_name9);
  }
  if(!req.scaling_rule_name10.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleName.10", req.scaling_rule_name10);
  }
  if(!req.scaling_rule_ari1.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleAri.1", req.scaling_rule_ari1);
  }
  if(!req.scaling_rule_ari2.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleAri.2", req.scaling_rule_ari2);
  }
  if(!req.scaling_rule_ari3.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleAri.3", req.scaling_rule_ari3);
  }
  if(!req.scaling_rule_ari4.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleAri.4", req.scaling_rule_ari4);
  }
  if(!req.scaling_rule_ari5.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleAri.5", req.scaling_rule_ari5);
  }
  if(!req.scaling_rule_ari6.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleAri.6", req.scaling_rule_ari6);
  }
  if(!req.scaling_rule_ari7.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleAri.7", req.scaling_rule_ari7);
  }
  if(!req.scaling_rule_ari8.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleAri.8", req.scaling_rule_ari8);
  }
  if(!req.scaling_rule_ari9.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleAri.9", req.scaling_rule_ari9);
  }
  if(!req.scaling_rule_ari10.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleAri.10", req.scaling_rule_ari10);
  }
  if(!req.owner_account.empty()) {
    req_rpc->AddRequestQuery("OwnerAccount", req.owner_account);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}